

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fft.cpp
# Opt level: O0

void cftleaf(int n,int isplt,double *a,int nw,double *w)

{
  double *w_local;
  int nw_local;
  double *a_local;
  int isplt_local;
  int n_local;
  
  if (n == 0x200) {
    cftmdl1(0x80,a,w + (nw + -0x40));
    cftf161(a,w + (nw + -8));
    cftf162(a + 0x20,w + (nw + -0x20));
    cftf161(a + 0x40,w + (nw + -8));
    cftf161(a + 0x60,w + (nw + -8));
    cftmdl2(0x80,a + 0x80,w + (nw + -0x80));
    cftf161(a + 0x80,w + (nw + -8));
    cftf162(a + 0xa0,w + (nw + -0x20));
    cftf161(a + 0xc0,w + (nw + -8));
    cftf162(a + 0xe0,w + (nw + -0x20));
    cftmdl1(0x80,a + 0x100,w + (nw + -0x40));
    cftf161(a + 0x100,w + (nw + -8));
    cftf162(a + 0x120,w + (nw + -0x20));
    cftf161(a + 0x140,w + (nw + -8));
    cftf161(a + 0x160,w + (nw + -8));
    if (isplt == 0) {
      cftmdl2(0x80,a + 0x180,w + (nw + -0x80));
      cftf162(a + 0x1e0,w + (nw + -0x20));
    }
    else {
      cftmdl1(0x80,a + 0x180,w + (nw + -0x40));
      cftf161(a + 0x1e0,w + (nw + -8));
    }
    cftf161(a + 0x180,w + (nw + -8));
    cftf162(a + 0x1a0,w + (nw + -0x20));
    cftf161(a + 0x1c0,w + (nw + -8));
  }
  else {
    cftmdl1(0x40,a,w + (nw + -0x20));
    cftf081(a,w + (nw + -8));
    cftf082(a + 0x10,w + (nw + -8));
    cftf081(a + 0x20,w + (nw + -8));
    cftf081(a + 0x30,w + (nw + -8));
    cftmdl2(0x40,a + 0x40,w + (nw + -0x40));
    cftf081(a + 0x40,w + (nw + -8));
    cftf082(a + 0x50,w + (nw + -8));
    cftf081(a + 0x60,w + (nw + -8));
    cftf082(a + 0x70,w + (nw + -8));
    cftmdl1(0x40,a + 0x80,w + (nw + -0x20));
    cftf081(a + 0x80,w + (nw + -8));
    cftf082(a + 0x90,w + (nw + -8));
    cftf081(a + 0xa0,w + (nw + -8));
    cftf081(a + 0xb0,w + (nw + -8));
    if (isplt == 0) {
      cftmdl2(0x40,a + 0xc0,w + (nw + -0x40));
      cftf082(a + 0xf0,w + (nw + -8));
    }
    else {
      cftmdl1(0x40,a + 0xc0,w + (nw + -0x20));
      cftf081(a + 0xf0,w + (nw + -8));
    }
    cftf081(a + 0xc0,w + (nw + -8));
    cftf082(a + 0xd0,w + (nw + -8));
    cftf081(a + 0xe0,w + (nw + -8));
  }
  return;
}

Assistant:

void cftleaf(int n, int isplt, double *a, int nw, double *w) {
  void cftmdl1(int n, double *a, double *w);
  void cftmdl2(int n, double *a, double *w);
  void cftf161(double *a, double *w);
  void cftf162(double *a, double *w);
  void cftf081(double *a, double *w);
  void cftf082(double *a, double *w);

  if (n == 512) {
    cftmdl1(128, a, &w[nw - 64]);
    cftf161(a, &w[nw - 8]);
    cftf162(&a[32], &w[nw - 32]);
    cftf161(&a[64], &w[nw - 8]);
    cftf161(&a[96], &w[nw - 8]);
    cftmdl2(128, &a[128], &w[nw - 128]);
    cftf161(&a[128], &w[nw - 8]);
    cftf162(&a[160], &w[nw - 32]);
    cftf161(&a[192], &w[nw - 8]);
    cftf162(&a[224], &w[nw - 32]);
    cftmdl1(128, &a[256], &w[nw - 64]);
    cftf161(&a[256], &w[nw - 8]);
    cftf162(&a[288], &w[nw - 32]);
    cftf161(&a[320], &w[nw - 8]);
    cftf161(&a[352], &w[nw - 8]);
    if (isplt != 0) {
      cftmdl1(128, &a[384], &w[nw - 64]);
      cftf161(&a[480], &w[nw - 8]);
    } else {
      cftmdl2(128, &a[384], &w[nw - 128]);
      cftf162(&a[480], &w[nw - 32]);
    }
    cftf161(&a[384], &w[nw - 8]);
    cftf162(&a[416], &w[nw - 32]);
    cftf161(&a[448], &w[nw - 8]);
  } else {
    cftmdl1(64, a, &w[nw - 32]);
    cftf081(a, &w[nw - 8]);
    cftf082(&a[16], &w[nw - 8]);
    cftf081(&a[32], &w[nw - 8]);
    cftf081(&a[48], &w[nw - 8]);
    cftmdl2(64, &a[64], &w[nw - 64]);
    cftf081(&a[64], &w[nw - 8]);
    cftf082(&a[80], &w[nw - 8]);
    cftf081(&a[96], &w[nw - 8]);
    cftf082(&a[112], &w[nw - 8]);
    cftmdl1(64, &a[128], &w[nw - 32]);
    cftf081(&a[128], &w[nw - 8]);
    cftf082(&a[144], &w[nw - 8]);
    cftf081(&a[160], &w[nw - 8]);
    cftf081(&a[176], &w[nw - 8]);
    if (isplt != 0) {
      cftmdl1(64, &a[192], &w[nw - 32]);
      cftf081(&a[240], &w[nw - 8]);
    } else {
      cftmdl2(64, &a[192], &w[nw - 64]);
      cftf082(&a[240], &w[nw - 8]);
    }
    cftf081(&a[192], &w[nw - 8]);
    cftf082(&a[208], &w[nw - 8]);
    cftf081(&a[224], &w[nw - 8]);
  }
}